

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::~cmd_result
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  long in_RDI;
  
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0xa0));
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::~function((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
               *)0x1c8f1d);
  std::function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)>::
  ~function((function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)> *
            )0x1c8f2b);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x1c8f39);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1c8f47);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1c8f51);
  return;
}

Assistant:

~cmd_result() {}